

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

int luaJIT_setmode(lua_State *L,int idx,int mode)

{
  global_State *g_00;
  uint uVar1;
  TValue *local_98;
  TValue *local_90;
  TValue *local_88;
  TValue *local_80;
  cTValue *tv_1;
  GCproto *pt;
  cTValue *tv;
  int mm;
  global_State *g;
  int mode_local;
  int idx_local;
  lua_State *L_local;
  uint32_t *segmap;
  uint64_t seg;
  uint64_t u;
  
  g_00 = (global_State *)(L->glref).ptr64;
  uVar1 = mode & 0xff;
  g_00[1].tmptv.field_4.it = g_00[1].tmptv.field_4.it & 0xffffffef;
  if ((g_00->hookmask & 0x40) != 0) {
    lj_err_caller(L,LJ_ERR_NOGCMM);
  }
  switch(uVar1) {
  case 0:
    if ((mode & 0x200U) == 0) {
      if ((mode & 0x100U) == 0) {
        g_00[1].str.id = g_00[1].str.id & 0xfffffffe;
      }
      else {
        g_00[1].str.id = g_00[1].str.id | 1;
      }
      lj_dispatch_update(g_00);
    }
    else {
      lj_trace_flushall(L);
    }
    break;
  default:
    return 0;
  case 2:
  case 3:
  case 4:
    if (idx == 0) {
      if ((L->base[-1].u64 & 3) == 0) {
        local_80 = L->base + (-1 - (ulong)((*(uint *)(L->base[-1].u64 - 4) >> 8 & 0xff) + 2));
      }
      else {
        local_80 = (TValue *)((long)L->base + (-8 - (L->base[-1].u64 & 0xfffffffffffffff8)));
      }
      local_88 = local_80 + -1;
    }
    else {
      if (idx < 1) {
        local_90 = L->top + idx;
      }
      else {
        local_90 = L->base + (idx + -1);
      }
      local_88 = local_90;
    }
    if (((idx == 0) || ((int)(local_88->field_4).it >> 0xf == -9)) &&
       (*(char *)((local_88->u64 & 0x7fffffffffff) + 10) == '\0')) {
      tv_1 = (cTValue *)(*(long *)((local_88->u64 & 0x7fffffffffff) + 0x20) + -0x68);
    }
    else {
      if ((int)(local_88->field_4).it >> 0xf != -8) {
        return 0;
      }
      tv_1 = (cTValue *)(local_88->u64 & 0x7fffffffffff);
    }
    if (uVar1 != 4) {
      setptmode(g_00,(GCproto *)&tv_1->gcr,mode);
    }
    if (uVar1 != 2) {
      setptmode_all(g_00,(GCproto *)&tv_1->gcr,mode);
    }
    break;
  case 5:
    if ((mode & 0x200U) == 0) {
      return 0;
    }
    lj_trace_flush((jit_State *)(g_00 + 1),idx);
    break;
  case 0x10:
    if ((mode & 0x100U) == 0) {
      g_00->bc_cfunc_ext = 0x5f;
    }
    else {
      if (idx == 0) {
        return 0;
      }
      if (idx < 1) {
        local_98 = L->top + idx;
      }
      else {
        local_98 = L->base + (idx + -1);
      }
      if ((int)(local_98->field_4).it >> 0xf != -4) {
        return 0;
      }
      g_00->wrapf = (lua_CFunction)
                    ((ulong)*(uint *)((g_00->gc).lightudseg.ptr64 +
                                     (local_98->u64 >> 0x27 & 0xff) * 4) << 0x20 |
                    local_98->u64 & 0x7fffffffff);
      g_00->bc_cfunc_ext = 0x60;
    }
  }
  return 1;
}

Assistant:

int luaJIT_setmode(lua_State *L, int idx, int mode)
{
  global_State *g = G(L);
  int mm = mode & LUAJIT_MODE_MASK;
  lj_trace_abort(g);  /* Abort recording on any state change. */
  /* Avoid pulling the rug from under our own feet. */
  if ((g->hookmask & HOOK_GC))
    lj_err_caller(L, LJ_ERR_NOGCMM);
  switch (mm) {
#if LJ_HASJIT
  case LUAJIT_MODE_ENGINE:
    if ((mode & LUAJIT_MODE_FLUSH)) {
      lj_trace_flushall(L);
    } else {
      if (!(mode & LUAJIT_MODE_ON))
	G2J(g)->flags &= ~(uint32_t)JIT_F_ON;
      else
	G2J(g)->flags |= (uint32_t)JIT_F_ON;
      lj_dispatch_update(g);
    }
    break;
  case LUAJIT_MODE_FUNC:
  case LUAJIT_MODE_ALLFUNC:
  case LUAJIT_MODE_ALLSUBFUNC: {
    cTValue *tv = idx == 0 ? frame_prev(L->base-1)-LJ_FR2 :
		  idx > 0 ? L->base + (idx-1) : L->top + idx;
    GCproto *pt;
    if ((idx == 0 || tvisfunc(tv)) && isluafunc(&gcval(tv)->fn))
      pt = funcproto(&gcval(tv)->fn);  /* Cannot use funcV() for frame slot. */
    else if (tvisproto(tv))
      pt = protoV(tv);
    else
      return 0;  /* Failed. */
    if (mm != LUAJIT_MODE_ALLSUBFUNC)
      setptmode(g, pt, mode);
    if (mm != LUAJIT_MODE_FUNC)
      setptmode_all(g, pt, mode);
    break;
    }
  case LUAJIT_MODE_TRACE:
    if (!(mode & LUAJIT_MODE_FLUSH))
      return 0;  /* Failed. */
    lj_trace_flush(G2J(g), idx);
    break;
#else
  case LUAJIT_MODE_ENGINE:
  case LUAJIT_MODE_FUNC:
  case LUAJIT_MODE_ALLFUNC:
  case LUAJIT_MODE_ALLSUBFUNC:
    UNUSED(idx);
    if ((mode & LUAJIT_MODE_ON))
      return 0;  /* Failed. */
    break;
#endif
  case LUAJIT_MODE_WRAPCFUNC:
    if ((mode & LUAJIT_MODE_ON)) {
      if (idx != 0) {
	cTValue *tv = idx > 0 ? L->base + (idx-1) : L->top + idx;
	if (tvislightud(tv))
	  g->wrapf = (lua_CFunction)lightudV(g, tv);
	else
	  return 0;  /* Failed. */
      } else {
	return 0;  /* Failed. */
      }
      g->bc_cfunc_ext = BCINS_AD(BC_FUNCCW, 0, 0);
    } else {
      g->bc_cfunc_ext = BCINS_AD(BC_FUNCC, 0, 0);
    }
    break;
  default:
    return 0;  /* Failed. */
  }
  return 1;  /* OK. */
}